

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall cashew::JSPrinter::printString(JSPrinter *this,Ref node)

{
  size_t sVar1;
  undefined8 *puVar2;
  Value *local_20;
  Ref node_local;
  
  local_20 = node.inst;
  maybeSpace(this,'\"');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = '\"';
  puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
  if (*(int *)*puVar2 == 0) {
    emit(this,*(char **)((int *)*puVar2 + 4));
    maybeSpace(this,'\"');
    ensure(this,1);
    sVar1 = this->used;
    this->used = sVar1 + 1;
    this->buffer[sVar1] = '\"';
    return;
  }
  __assert_fail("isString()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0xeb,"const char *cashew::Value::getCString()");
}

Assistant:

void printString(Ref node) {
    emit('"');
    emit(node[1]->getCString());
    emit('"');
  }